

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlValidateDocument(void)

{
  int iVar1;
  int iVar2;
  xmlValidCtxtPtr val;
  xmlDocPtr val_00;
  int local_34;
  int n_doc;
  xmlDocPtr doc;
  int n_ctxt;
  xmlValidCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (doc._4_4_ = 0; (int)doc._4_4_ < 2; doc._4_4_ = doc._4_4_ + 1) {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlValidCtxtPtr(doc._4_4_,0);
      val_00 = gen_xmlDocPtr(local_34,1);
      iVar2 = xmlValidateDocument(val,val_00);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_xmlValidCtxtPtr(doc._4_4_,val,0);
      des_xmlDocPtr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateDocument",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)doc._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlValidateDocument(void) {
    int test_ret = 0;

#if defined(LIBXML_VALID_ENABLED)
    int mem_base;
    int ret_val;
    xmlValidCtxtPtr ctxt; /* the validation context */
    int n_ctxt;
    xmlDocPtr doc; /* a document instance */
    int n_doc;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlValidCtxtPtr;n_ctxt++) {
    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlValidCtxtPtr(n_ctxt, 0);
        doc = gen_xmlDocPtr(n_doc, 1);

        ret_val = xmlValidateDocument(ctxt, doc);
        desret_int(ret_val);
        call_tests++;
        des_xmlValidCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlDocPtr(n_doc, doc, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlValidateDocument",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_doc);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}